

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMan.c
# Opt level: O2

void Abc_NodeCovDropData(Cov_Man_t *p,Abc_Obj_t *pObj)

{
  Min_Man_t *pMVar1;
  Min_Cube_t *pMVar2;
  uint uVar3;
  Cov_Obj_t *pCVar4;
  Min_Cube_t *pMVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  Min_Cube_t *pEntry;
  
  pVVar6 = p->vFanCounts;
  if (pVVar6 == (Vec_Int_t *)0x0) {
    __assert_fail("p->vFanCounts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covMan.c"
                  ,0x81,"void Abc_NodeCovDropData(Cov_Man_t *, Abc_Obj_t *)");
  }
  uVar3 = pObj->Id;
  if (((long)(int)uVar3 < 0) || (pVVar6->nSize <= (int)uVar3)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if (pVVar6->pArray[(int)uVar3] < 1) {
    __assert_fail("nFanouts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covMan.c"
                  ,0x83,"void Abc_NodeCovDropData(Cov_Man_t *, Abc_Obj_t *)");
  }
  iVar7 = pVVar6->pArray[(int)uVar3] + -1;
  if (iVar7 == 0) {
    pCVar4 = Abc_ObjGetStr(pObj);
    Vec_IntFree(pCVar4->vSupp);
    pCVar4 = Abc_ObjGetStr(pObj);
    pCVar4->vSupp = (Vec_Int_t *)0x0;
    pMVar1 = p->pManMin;
    pCVar4 = Abc_ObjGetStr(pObj);
    pEntry = pCVar4->pCover[2];
    if (pEntry == (Min_Cube_t *)0x0) {
      pMVar2 = (Min_Cube_t *)0x0;
    }
    else {
      pMVar2 = pEntry->pNext;
    }
    while (pMVar5 = pMVar2, pEntry != (Min_Cube_t *)0x0) {
      Extra_MmFixedEntryRecycle(pMVar1->pMemMan,(char *)pEntry);
      pMVar2 = (Min_Cube_t *)0x0;
      pEntry = pMVar5;
      if (pMVar5 != (Min_Cube_t *)0x0) {
        pMVar2 = pMVar5->pNext;
      }
    }
    pCVar4 = Abc_ObjGetStr(pObj);
    pCVar4->pCover[2] = (Min_Cube_t *)0x0;
    p->nSupps = p->nSupps + -1;
    uVar3 = pObj->Id;
    if ((int)uVar3 < 0) goto LAB_003a7d38;
    pVVar6 = p->vFanCounts;
  }
  if ((int)uVar3 < pVVar6->nSize) {
    pVVar6->pArray[uVar3] = iVar7;
    return;
  }
LAB_003a7d38:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

void Abc_NodeCovDropData( Cov_Man_t * p, Abc_Obj_t * pObj )
{
    int nFanouts;
    assert( p->vFanCounts );
    nFanouts = Vec_IntEntry( p->vFanCounts, pObj->Id );
    assert( nFanouts > 0 );
    if ( --nFanouts == 0 )
    {
        Vec_IntFree( Abc_ObjGetSupp(pObj) );
        Abc_ObjSetSupp( pObj, NULL );
        Min_CoverRecycle( p->pManMin, Abc_ObjGetCover2(pObj) );
        Abc_ObjSetCover2( pObj, NULL );
        p->nSupps--;
    }
    Vec_IntWriteEntry( p->vFanCounts, pObj->Id, nFanouts );
}